

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertable_log.c
# Opt level: O2

int mpt_convertable_log(mpt_convertable *dest,char *fcn,int type,char *fmt,...)

{
  char in_AL;
  int iVar1;
  mpt_logger *pmVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  __va_list_tag local_e8;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (dest == (mpt_convertable *)0x0) {
    pmVar2 = mpt_log_default();
    if (pmVar2 == (mpt_logger *)0x0) {
      iVar1 = 0;
    }
    else {
      local_e8.reg_save_area = local_c8;
      local_e8.overflow_arg_area = &va[0].overflow_arg_area;
      local_e8.gp_offset = 0x20;
      local_e8.fp_offset = 0x30;
      iVar1 = (*pmVar2->_vptr->log)(pmVar2,fcn,type,fmt,&local_e8);
    }
  }
  else {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &va[0].overflow_arg_area;
    local_e8.gp_offset = 0x20;
    local_e8.fp_offset = 0x30;
    iVar1 = mpt_convertable_vlog(dest,fcn,type | 0xb00,fmt,&local_e8);
  }
  return iVar1;
}

Assistant:

int mpt_convertable_log(MPT_INTERFACE(convertable) *dest, const char *fcn, int type, const char *fmt, ...)
{
	va_list va;
	MPT_INTERFACE(logger) *log = 0;
	int ret = 0;
	
	if (!dest && !(log  = mpt_log_default())) {
		return 0;
	}
	va_start(va, fmt);
	if (dest) {
		ret = mpt_convertable_vlog(dest, fcn, type | MPT_ENUM(LogFunction) | MPT_ENUM(LogPretty), fmt, va);
	} else {
		ret = log->_vptr->log(log, fcn, type, fmt, va);
	}
	va_end(va);
	return ret;
}